

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::Datum::ByteSizeLong(Datum *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int32 iVar4;
  UnknownFieldSet *unknown_fields;
  size_t sVar5;
  string *value;
  int cached_size;
  size_t data_size;
  size_t sStack_38;
  uint count;
  size_t total_size;
  Datum *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = Datum::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = float_data_size(this);
  iVar3 = float_data_size(this);
  sVar5 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_38 = (ulong)uVar2 * 4 + sVar5 + sStack_38;
  if (((this->_has_bits_).has_bits_[0] & 0x3f) != 0) {
    bVar1 = has_data(this);
    if (bVar1) {
      value = data_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::BytesSize(value);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_channels(this);
    if (bVar1) {
      iVar4 = channels(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_height(this);
    if (bVar1) {
      iVar4 = height(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_width(this);
    if (bVar1) {
      iVar4 = width(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_label(this);
    if (bVar1) {
      iVar4 = label(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_encoded(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t Datum::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.Datum)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float float_data = 6;
  {
    unsigned int count = this->float_data_size();
    size_t data_size = 4UL * count;
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->float_data_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional bytes data = 4;
    if (has_data()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->data());
    }

    // optional int32 channels = 1;
    if (has_channels()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->channels());
    }

    // optional int32 height = 2;
    if (has_height()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->height());
    }

    // optional int32 width = 3;
    if (has_width()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->width());
    }

    // optional int32 label = 5;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->label());
    }

    // optional bool encoded = 7 [default = false];
    if (has_encoded()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}